

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O1

tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
* generate_list<trng::lcg64_shift>
            (tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             *__return_storage_ptr__,lcg64_shift *r1,lcg64_shift *r2,long N,long skip1,long skip2)

{
  _Tuple_impl<0ul,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  *p_Var1;
  result_type rVar2;
  long lVar3;
  long lVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> v2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> v1;
  ulong local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  _Tuple_impl<0ul,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  *local_38;
  
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_38 = (_Tuple_impl<0ul,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
              *)__return_storage_ptr__;
  if (0 < N) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_58,N);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_78,N);
    lVar3 = 0;
    do {
      local_80 = (r1->S).r * (r1->P).a + (r1->P).b;
      (r1->S).r = local_80;
      local_80 = local_80 >> 0x11 ^ local_80;
      local_80 = local_80 << 0x1f ^ local_80;
      local_80 = local_80 >> 8 ^ local_80;
      if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_58,
                   (iterator)
                   local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_80);
      }
      else {
        *local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_80;
        local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_80 = (r2->S).r * (r2->P).a + (r2->P).b;
      (r2->S).r = local_80;
      local_80 = local_80 >> 0x11 ^ local_80;
      local_80 = local_80 << 0x1f ^ local_80;
      local_80 = local_80 >> 8 ^ local_80;
      if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_78,
                   (iterator)
                   local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_80);
      }
      else {
        *local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_80;
        local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (0 < skip1) {
        rVar2 = (r1->S).r;
        lVar4 = skip1;
        do {
          rVar2 = rVar2 * (r1->P).a + (r1->P).b;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        (r1->S).r = rVar2;
      }
      if (0 < skip2) {
        rVar2 = (r2->S).r;
        lVar4 = skip2;
        do {
          rVar2 = rVar2 * (r2->P).a + (r2->P).b;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        (r2->S).r = rVar2;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != N);
  }
  p_Var1 = local_38;
  std::
  _Tuple_impl<0ul,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  ::
  _Tuple_impl<std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,void>
            (local_38,&local_58,&local_78);
  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return (tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          *)p_Var1;
}

Assistant:

std::tuple<std::vector<typename R::result_type>, std::vector<typename R::result_type>>
generate_list(R &r1, R &r2, const long N, const long skip1, const long skip2) {
  std::vector<typename R::result_type> v1, v2;
  if (N > 0) {
    v1.reserve(N);
    v2.reserve(N);
  }
  for (long i{0}; i < N; ++i) {
    v1.push_back(r1());
    v2.push_back(r2());
    for (long j{0}; j < skip1; ++j)
      r1();
    for (long j{0}; j < skip2; ++j)
      r2();
  }
  return {v1, v2};
}